

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::tuple_caster<std::pair,bool,std::__cxx11::string>::
       cast_impl<std::pair<bool,std::__cxx11::string>,0ul,1ul>
                 (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *src,return_value_policy policy,handle parent)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  type *ptVar4;
  handle hVar5;
  type *src_00;
  iterator pvVar6;
  PyObject **ppPVar7;
  handle local_d8;
  iterator local_d0;
  value_type *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_2UL> *__range3_1;
  int counter;
  tuple result;
  value_type *entry;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range3;
  undefined1 local_40 [8];
  array<pybind11::object,_2UL> entries;
  return_value_policy policy_local;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *src_local;
  handle parent_local;
  
  entries._M_elems[1].super_handle.m_ptr._7_1_ = policy;
  ptVar4 = std::get<0ul,bool,std::__cxx11::string>(src);
  hVar5 = type_caster<bool,_void>::cast
                    ((bool)(*ptVar4 & 1),entries._M_elems[1].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)local_40,hVar5);
  src_00 = std::get<1ul,bool,std::__cxx11::string>(src);
  hVar5 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::cast(src_00,entries._M_elems[1].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)&entries,hVar5);
  __end0 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)local_40);
  pvVar6 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)local_40);
  do {
    if (__end0 == pvVar6) {
      pybind11::tuple::tuple<unsigned_long,_0>((tuple *)&stack0xffffffffffffff58,2);
      __range3_1._4_4_ = 0;
      __begin0_1 = (iterator)local_40;
      __end0_1 = std::array<pybind11::object,_2UL>::begin
                           ((array<pybind11::object,_2UL> *)__begin0_1);
      entry_1 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)__begin0_1);
      for (; __end0_1 != entry_1; __end0_1 = __end0_1 + 1) {
        local_d0 = __end0_1;
        local_d8 = object::release(__end0_1);
        ppPVar7 = pybind11::handle::ptr(&local_d8);
        pPVar1 = (PyTypeObject *)*ppPVar7;
        ppPVar7 = pybind11::handle::ptr((handle *)&stack0xffffffffffffff58);
        iVar3 = ::PyType_HasFeature((*ppPVar7)->ob_type,0x4000000);
        if (iVar3 == 0) {
          __assert_fail("PyTuple_Check(result.ptr())",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                        ,0x280,
                        "static handle pybind11::detail::tuple_caster<std::pair, bool, std::basic_string<char>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::pair, Ts = <bool, std::basic_string<char>>, T = std::pair<bool, std::basic_string<char>>, Is = <0UL, 1UL>]"
                       );
        }
        ppPVar7 = pybind11::handle::ptr((handle *)&stack0xffffffffffffff58);
        (&(*ppPVar7)[1].ob_type)[__range3_1._4_4_] = pPVar1;
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
      }
      parent_local = object::release((object *)&stack0xffffffffffffff58);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      pybind11::tuple::~tuple((tuple *)&stack0xffffffffffffff58);
LAB_007b71fa:
      std::array<pybind11::object,_2UL>::~array((array<pybind11::object,_2UL> *)local_40);
      return (handle)parent_local.m_ptr;
    }
    bVar2 = pybind11::handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) {
      memset(&parent_local,0,8);
      pybind11::handle::handle(&parent_local);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      goto LAB_007b71fa;
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(src, policy, parent);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(policy, parent);
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }